

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O3

void FRandom::StaticWriteRNGState(FSerializer *arc)

{
  FRandom *pFVar1;
  bool bVar2;
  FSerializer *pFVar3;
  
  ::Serialize(arc,"rngseed",&rngseed,(uint32_t *)0x0);
  bVar2 = FSerializer::BeginArray(arc,"rngs");
  pFVar1 = RNGList;
  if (!bVar2) {
    return;
  }
  for (; pFVar1 != (FRandom *)0x0; pFVar1 = pFVar1->Next) {
    if ((pFVar1->NameCRC != 0) && (bVar2 = FSerializer::BeginObject(arc,(char *)0x0), bVar2)) {
      pFVar3 = ::Serialize(arc,"crc",&pFVar1->NameCRC,(uint32_t *)0x0);
      pFVar3 = ::Serialize(pFVar3,"index",&pFVar1->idx,(int32_t *)0x0);
      pFVar3 = FSerializer::Array<unsigned_int>(pFVar3,"u",(pFVar1->sfmt).u,0x14,false);
      FSerializer::EndObject(pFVar3);
    }
  }
  FSerializer::EndArray(arc);
  return;
}

Assistant:

void FRandom::StaticWriteRNGState (FSerializer &arc)
{
	FRandom *rng;

	arc("rngseed", rngseed);

	if (arc.BeginArray("rngs"))
	{
		for (rng = FRandom::RNGList; rng != NULL; rng = rng->Next)
		{
			// Only write those RNGs that have names
			if (rng->NameCRC != 0)
			{
				if (arc.BeginObject(nullptr))
				{
					arc("crc", rng->NameCRC)
						("index", rng->idx)
						.Array("u", rng->sfmt.u, SFMT::N32)
						.EndObject();
				}
			}
		}
		arc.EndArray();
	}
}